

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O1

void __thiscall pg::RTLSolver::~RTLSolver(RTLSolver *this)

{
  uint *puVar1;
  uint64_t *puVar2;
  pointer piVar3;
  pointer ppiVar4;
  
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__RTLSolver_001a7ad8;
  puVar1 = (this->Q).queue;
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  puVar2 = (this->W)._bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
  }
  puVar2 = (this->V)._bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
  }
  puVar2 = (this->S)._bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
  }
  puVar2 = (this->G)._bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
  }
  puVar2 = (this->Z)._bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
  }
  puVar2 = (this->R)._bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
  }
  puVar2 = (this->escapes)._bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
  }
  puVar1 = (this->tangleto).queue;
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  piVar3 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  puVar2 = (this->pea_root)._bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
  }
  puVar1 = (this->pea_S).queue;
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  puVar1 = (this->pea_state).queue;
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  piVar3 = (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  ppiVar4 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppiVar4 != (pointer)0x0) {
    operator_delete(ppiVar4,(long)(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppiVar4)
    ;
  }
  ppiVar4 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppiVar4 != (pointer)0x0) {
    operator_delete(ppiVar4,(long)(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppiVar4)
    ;
    return;
  }
  return;
}

Assistant:

RTLSolver::~RTLSolver()
{
}